

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void mu_cv_ping_pong(ping_pong *pp,int parity)

{
  uint uVar1;
  
  nsync_mu_lock(&pp->mu);
  while (uVar1 = pp->i, (int)uVar1 < pp->limit) {
    while ((uVar1 & 1) == parity) {
      nsync_cv_wait(pp->cv + (uint)parity,&pp->mu);
      uVar1 = pp->i;
    }
    pp->i = uVar1 + 1;
    nsync_cv_signal(pp->cv + (1 - parity));
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mu_cv_ping_pong (ping_pong *pp, int parity) {
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait (&pp->cv[parity], &pp->mu);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}